

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int readDisplacement(InternalInstruction *insn)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint offset;
  long lVar6;
  uint8_t byte;
  uint8_t byte_1;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  iVar1 = 0;
  if (insn->consumedDisplacement == false) {
    insn->consumedDisplacement = true;
    insn->displacementOffset = (char)(int)insn->readerCursor - (char)(int)insn->startLocation;
    iVar1 = 0;
    switch(insn->eaDisplacement) {
    case EA_DISP_NONE:
      insn->consumedDisplacement = false;
      iVar1 = 0;
      break;
    case EA_DISP_8:
      bVar2 = true;
      bVar4 = 0;
      do {
        if (!bVar2) {
          insn->readerCursor = insn->readerCursor + 1;
          lVar6 = (long)(char)bVar4;
          goto LAB_00229b53;
        }
        iVar1 = (*insn->reader)((reader_info *)insn->readerArg,&local_2b,insn->readerCursor);
        bVar4 = bVar4 | local_2b;
        bVar2 = false;
      } while (iVar1 == 0);
LAB_00229b41:
      iVar1 = -1;
      break;
    case EA_DISP_16:
      lVar6 = 0;
      uVar5 = 0;
      bVar2 = true;
      do {
        bVar3 = bVar2;
        iVar1 = (*insn->reader)((reader_info *)insn->readerArg,&local_2a,insn->readerCursor + lVar6)
        ;
        if (iVar1 != 0) goto LAB_00229b41;
        uVar5 = uVar5 | (uint)local_2a << (sbyte)((int)lVar6 << 3);
        lVar6 = 1;
        bVar2 = false;
      } while (bVar3);
      insn->readerCursor = insn->readerCursor + 2;
      insn->displacement = (long)(short)uVar5;
      iVar1 = 0;
      break;
    case EA_DISP_32:
      bVar4 = 0;
      lVar6 = 0;
      uVar5 = 0;
      do {
        iVar1 = (*insn->reader)((reader_info *)insn->readerArg,&local_29,insn->readerCursor + lVar6)
        ;
        if (iVar1 != 0) goto LAB_00229b41;
        uVar5 = uVar5 | (uint)local_29 << (bVar4 & 0x3f);
        lVar6 = lVar6 + 1;
        bVar4 = bVar4 + 8;
      } while (lVar6 != 4);
      insn->readerCursor = insn->readerCursor + 4;
      lVar6 = (long)(int)uVar5;
LAB_00229b53:
      insn->displacement = lVar6;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int readDisplacement(struct InternalInstruction *insn)
{
	int8_t d8;
	int16_t d16;
	int32_t d32;

	// dbgprintf(insn, "readDisplacement()");

	if (insn->consumedDisplacement)
		return 0;

	insn->consumedDisplacement = true;
	insn->displacementOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (insn->eaDisplacement) {
		case EA_DISP_NONE:
			insn->consumedDisplacement = false;
			break;
		case EA_DISP_8:
			if (consumeInt8(insn, &d8))
				return -1;
			insn->displacement = d8;
			break;
		case EA_DISP_16:
			if (consumeInt16(insn, &d16))
				return -1;
			insn->displacement = d16;
			break;
		case EA_DISP_32:
			if (consumeInt32(insn, &d32))
				return -1;
			insn->displacement = d32;
			break;
	}

	return 0;
}